

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_fourier_transform.cc
# Opt level: O3

void __thiscall
sptk::FastFourierTransform::FastFourierTransform
          (FastFourierTransform *this,int num_order,int fft_length)

{
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  double dVar2;
  bool bVar3;
  pointer pdVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  
  this->_vptr_FastFourierTransform = (_func_int **)&PTR__FastFourierTransform_00112cf8;
  this->num_order_ = num_order;
  this->fft_length_ = fft_length;
  this->half_fft_length_ = fft_length / 2;
  this->is_valid_ = true;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (num_order < fft_length && -1 < num_order) {
    this_00 = &this->sine_table_;
    bVar3 = IsPowerOfTwo(fft_length);
    if (bVar3) {
      iVar1 = this->fft_length_;
      iVar6 = iVar1 + 3;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      uVar5 = (iVar1 - (iVar6 >> 2)) + 1;
      std::vector<double,_std::allocator<double>_>::resize(this_00,(long)(int)uVar5);
      if (iVar1 - (iVar6 >> 2) < 0) {
        pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        uVar7 = 0;
        do {
          dVar2 = sin((double)(int)uVar7 *
                      (3.141592653589793 / (double)iVar1 + 3.141592653589793 / (double)iVar1));
          pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar7] = dVar2;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      pdVar4[this->fft_length_ / 2] = 0.0;
      return;
    }
  }
  this->is_valid_ = false;
  return;
}

Assistant:

FastFourierTransform::FastFourierTransform(int num_order, int fft_length)
    : num_order_(num_order),
      fft_length_(fft_length),
      half_fft_length_(fft_length_ / 2),
      is_valid_(true) {
  if (num_order_ < 0 || fft_length_ <= num_order_ ||
      !sptk::IsPowerOfTwo(fft_length_)) {
    is_valid_ = false;
    return;
  }

  const int table_size(fft_length_ - fft_length_ / 4 + 1);
  const double argument(sptk::kPi / fft_length_ * 2);
  sine_table_.resize(table_size);
  for (int i(0); i < table_size; ++i) {
    sine_table_[i] = std::sin(argument * i);
  }
  sine_table_[fft_length_ / 2] = 0.0;
}